

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing.cc
# Opt level: O1

int memicmp(void *s1,void *s2,size_t len)

{
  int iVar1;
  void *__s;
  void *__s_00;
  size_t sVar2;
  
  __s = operator_new__(len);
  memset(__s,0,len);
  __s_00 = operator_new__(len);
  memset(__s_00,0,len);
  if (len != 0) {
    sVar2 = 0;
    do {
      iVar1 = tolower((int)*(char *)((long)s1 + sVar2));
      *(char *)((long)__s + sVar2) = (char)iVar1;
      iVar1 = tolower((int)*(char *)((long)s2 + sVar2));
      *(char *)((long)__s_00 + sVar2) = (char)iVar1;
      sVar2 = sVar2 + 1;
    } while (len != sVar2);
  }
  iVar1 = memcmp(__s,__s_00,len);
  operator_delete__(__s_00);
  operator_delete__(__s);
  return iVar1;
}

Assistant:

int
memicmp( const void* s1, const void* s2, size_t len )
{
    const auto x1 = std::make_unique<char[]>(len);
    const auto x2 = std::make_unique<char[]>(len);

    for (size_t i = 0; i < len; ++i) {
        x1[i] = tolower(static_cast<const char*>(s1)[i]);
        x2[i] = tolower(static_cast<const char*>(s2)[i]);
    }
    return memcmp(x1.get(), x2.get(), len);
}